

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exereader.cpp
# Opt level: O2

uint32_t loader::anon_unknown_0::pe_reader::find_resource_entry(istream *is,uint32_t id)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  istream *is_00;
  long lVar6;
  
  plVar5 = (long *)std::istream::seekg((long)is,0xc);
  if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
    uVar1 = util::load<short,util::little_endian>(is);
    uVar2 = util::load<short,util::little_endian>(is);
    if (id == 0xffffffff) {
      is_00 = (istream *)std::istream::seekg((long)is,4);
      uVar3 = util::load<int,util::little_endian>(is_00);
      if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) == 0) {
        return uVar3;
      }
      return 0;
    }
    plVar5 = (long *)std::istream::seekg((long)is,(uint)uVar1 << 3);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      lVar6 = (ulong)uVar2 + 1;
      while (lVar6 = lVar6 + -1, lVar6 != 0) {
        uVar3 = util::load<int,util::little_endian>(is);
        uVar4 = util::load<int,util::little_endian>(is);
        if (((&is->field_0x20)[(long)is->_vptr_basic_istream[-3]] & 5) != 0) {
          return 0;
        }
        if (uVar3 == id) {
          return uVar4;
        }
      }
    }
  }
  return 0;
}

Assistant:

boost::uint32_t pe_reader::find_resource_entry(std::istream & is, boost::uint32_t id) {
	
	// skip: characteristics + timestamp + major version + minor version
	if(is.seekg(4 + 4 + 2 + 2, std::ios_base::cur).fail()) {
		return 0;
	}
	
	// Number of named resource entries.
	boost::uint16_t nbnames = util::load<boost::uint16_t>(is);
	
	// Number of id resource entries.
	boost::uint16_t nbids = util::load<boost::uint16_t>(is);
	
	if(id == Default) {
		boost::uint32_t offset = util::load<boost::uint32_t>(is.seekg(4, std::ios_base::cur));
		return is.fail() ? 0 : offset;
	}
	
	// Ignore named resource entries.
	const boost::uint32_t entry_size = 4 + 4; // id / string address + offset
	if(is.seekg(nbnames * entry_size, std::ios_base::cur).fail()) {
		return 0;
	}
	
	for(size_t i = 0; i < nbids; i++) {
		
		boost::uint32_t entry_id = util::load<boost::uint32_t>(is);
		boost::uint32_t entry_offset = util::load<boost::uint32_t>(is);
		if(is.fail()) {
			return 0;
		}
		
		if(entry_id == id) {
			return entry_offset;
		}
		
	}
	
	return 0;
}